

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  bool bVar1;
  const_reference pvVar2;
  ostream *poVar3;
  reference pcVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  *this_00;
  pointer ppVar5;
  char *pcVar6;
  allocator local_131;
  string local_130;
  string local_110;
  iterator local_f0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
  local_e8;
  iterator local_e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
  local_d8;
  const_iterator i;
  cmPropertyMap *pm;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  const_iterator c;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  const_iterator argit;
  undefined1 local_48 [8];
  string exe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command;
  ostream *fout_local;
  cmTestGenerator *this_local;
  Indent indent_local;
  
  this->TestGenerated = true;
  exe.field_2._8_8_ = cmTest::GetCommand_abi_cxx11_(this->Test);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)exe.field_2._8_8_,0);
  std::__cxx11::string::string((string *)local_48,(string *)pvVar2);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
  ::operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(fout,"add_test(");
  cmTest::GetName_abi_cxx11_((string *)&argit,this->Test);
  poVar3 = std::operator<<(fout,(string *)&argit);
  poVar3 = std::operator<<(poVar3," \"");
  poVar3 = std::operator<<(poVar3,(string *)local_48);
  std::operator<<(poVar3,"\"");
  std::__cxx11::string::~string((string *)&argit);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)exe.field_2._8_8_);
  local_80 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator+(&local_88,1);
  while( true ) {
    c._M_current = (char *)std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)exe.field_2._8_8_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&c);
    if (!bVar1) break;
    std::operator<<(fout," \"");
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_80);
    local_98._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_80);
      pm = (cmPropertyMap *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        (&local_98,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pm);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_98);
      if (*pcVar4 == '\"') {
        std::operator<<(fout,'\\');
      }
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_98);
      std::operator<<(fout,*pcVar4);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_98);
    }
    std::operator<<(fout,"\"");
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_80);
  }
  poVar3 = std::operator<<(fout,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this_00 = &cmTest::GetProperties(this->Test)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
          ::empty(this_00);
  if (!bVar1) {
    poVar3 = ::operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
    poVar3 = std::operator<<(poVar3,"set_tests_properties(");
    cmTest::GetName_abi_cxx11_((string *)&i,this->Test);
    poVar3 = std::operator<<(poVar3,(string *)&i);
    std::operator<<(poVar3," PROPERTIES ");
    std::__cxx11::string::~string((string *)&i);
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         ::begin(this_00);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
    ::_Rb_tree_const_iterator(&local_d8,&local_e0);
    while( true ) {
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ::end(this_00);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
      ::_Rb_tree_const_iterator(&local_e8,&local_f0);
      bVar1 = std::operator!=(&local_d8,&local_e8);
      if (!bVar1) break;
      poVar3 = std::operator<<(fout," ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
               ::operator->(&local_d8);
      poVar3 = std::operator<<(poVar3,(string *)ppVar5);
      poVar3 = std::operator<<(poVar3," ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
               ::operator->(&local_d8);
      pcVar6 = cmProperty::GetValue(&ppVar5->second);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,pcVar6,&local_131);
      cmOutputConverter::EscapeForCMake(&local_110,&local_130);
      std::operator<<(poVar3,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
      ::operator++(&local_d8);
    }
    poVar3 = std::operator<<(fout,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  fout << indent;
  fout << "add_test(";
  fout << this->Test->GetName() << " \"" << exe << "\"";

  for (std::vector<std::string>::const_iterator argit = command.begin() + 1;
       argit != command.end(); ++argit) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (std::string::const_iterator c = argit->begin(); c != argit->end();
         ++c) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if ((*c == '"')) {
        fout << '\\';
      }
      fout << *c;
    }
    fout << "\"";
  }
  fout << ")" << std::endl;

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if (!pm.empty()) {
    fout << indent << "set_tests_properties(" << this->Test->GetName()
         << " PROPERTIES ";
    for (cmPropertyMap::const_iterator i = pm.begin(); i != pm.end(); ++i) {
      fout << " " << i->first << " "
           << cmOutputConverter::EscapeForCMake(i->second.GetValue());
    }
    fout << ")" << std::endl;
  }
}